

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O3

int fits_uncompress_hkdata(ParseData *lParse,fitsfile *fptr,long ntimes,double *times,int *status)

{
  uint uVar1;
  iteratorCol *piVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  char *err_message;
  long lVar8;
  fitsfile *fptr_00;
  double dVar9;
  double dVar10;
  int anynul;
  LONGLONG local_568;
  double local_560;
  fitsfile *local_558;
  int *local_550;
  long local_548;
  long naxis2;
  double *local_538;
  double local_530;
  double newtime;
  char *sPtr [1];
  char parName [256];
  char found [1000];
  
  sPtr[0] = parName;
  uVar1 = lParse->nCols;
  local_548 = ntimes;
  local_538 = times;
  if ((ulong)uVar1 != 0) {
    memset(found + ((long)(int)(uVar1 - 1) - (ulong)(uVar1 - 1)),0,(ulong)uVar1);
  }
  iVar4 = ffgkyj(fptr,"NAXIS2",&naxis2,(char *)0x0,status);
  if (iVar4 == 0) {
    if (naxis2 < 1) {
      dVar9 = 0.0;
    }
    else {
      lVar5 = 1;
      local_560 = -1e+38;
      lVar6 = 0;
      local_558 = fptr;
      local_550 = status;
      do {
        status = local_550;
        fptr_00 = local_558;
        iVar4 = ffgcvd(local_558,lParse->timeCol,lVar5,1,1,0.0,&newtime,&anynul,local_550);
        if (iVar4 != 0) goto LAB_00129700;
        local_568 = lVar5;
        if ((newtime != local_560) ||
           (dVar9 = (double)lVar6, dVar10 = local_560, NAN(newtime) || NAN(local_560))) {
          if (lVar6 == local_548) {
            err_message = "Found more unique time stamps than caller indicated";
            goto LAB_00129a76;
          }
          local_538[lVar6] = newtime;
          lVar5 = (long)lParse->nCols;
          if (lVar5 == 0) {
            local_560 = newtime;
            dVar9 = (double)(lVar6 + 1);
            dVar10 = local_560;
          }
          else {
            lVar8 = lVar5 * 0x110 + -0xb0;
            local_530 = newtime;
            dVar10 = newtime;
            local_560 = (double)(lVar6 + 1);
            do {
              piVar2 = lParse->colData;
              iVar4 = *(int *)(piVar2->colname + lVar8 + -0x18);
              if (iVar4 == 0x10) {
                strcpy(*(char **)(*(long *)(piVar2->colname + lVar8 + -0xc) + 8 + lVar6 * 8),
                       *(char **)(*(long *)(piVar2->colname + lVar8 + -0xc) + lVar6 * 8));
                dVar10 = local_530;
              }
              else if (iVar4 == 0x52) {
                *(undefined8 *)(*(long *)(piVar2->colname + lVar8 + -0xc) + 8 + lVar6 * 8) =
                     *(undefined8 *)(*(long *)(piVar2->colname + lVar8 + -0xc) + lVar6 * 8);
              }
              else if (iVar4 == 0x29) {
                *(undefined8 *)(*(long *)(piVar2->colname + lVar8 + -0xc) + 8 + lVar6 * 8) =
                     *(undefined8 *)(*(long *)(piVar2->colname + lVar8 + -0xc) + lVar6 * 8);
              }
              lVar5 = lVar5 + -1;
              lVar8 = lVar8 + -0x110;
              fptr_00 = local_558;
              dVar9 = local_560;
            } while (lVar5 != 0);
          }
        }
        local_560 = dVar10;
        iVar4 = ffgcvs(fptr_00,lParse->parCol,local_568,1,1,"",sPtr,&anynul,status);
        if (iVar4 != 0) goto LAB_00129700;
        lVar6 = (long)lParse->nCols;
        lVar8 = 0;
        lVar5 = lVar6 * 0xa0;
        do {
          if (lVar6 == lVar8) goto LAB_001299cb;
          iVar4 = fits_strcasecmp(parName,lParse->varData[-1].name + lVar5);
          piVar3 = local_550;
          lVar8 = lVar8 + 1;
          lVar5 = lVar5 + -0xa0;
        } while (iVar4 != 0);
        uVar7 = lVar6 - lVar8;
        if (uVar7 != 0xffffffffffffffff && -1 < (long)(uVar7 + 1)) {
          uVar7 = uVar7 & 0xffffffff;
          found[uVar7] = '\x01';
          piVar2 = lParse->colData;
          iVar4 = piVar2[uVar7].datatype;
          if (iVar4 == 0x10) {
            ffgcvs(local_558,lParse->valCol,local_568,1,1,*piVar2[uVar7].array,
                   (char **)((long)piVar2[uVar7].array + dVar9 * 8),&anynul,local_550);
          }
          else if (iVar4 == 0x52) {
            ffgcvd(local_558,lParse->valCol,local_568,1,1,*piVar2[uVar7].array,
                   (double *)((long)piVar2[uVar7].array + dVar9 * 8),&anynul,local_550);
          }
          else if (iVar4 == 0x29) {
            ffgcvj(local_558,lParse->valCol,local_568,1,1,*piVar2[uVar7].array,
                   (long *)((long)piVar2[uVar7].array + dVar9 * 8),&anynul,local_550);
          }
          if (*piVar3 != 0) {
            return *piVar3;
          }
        }
LAB_001299cb:
        lVar5 = local_568 + 1;
        status = local_550;
        lVar6 = (long)dVar9;
      } while (local_568 < naxis2);
    }
    if ((long)dVar9 < local_548) {
      err_message = "Found fewer unique time stamps than caller indicated";
LAB_00129a76:
      ffpmsg(err_message);
      *status = 0x1b3;
      return 0x1b3;
    }
    lVar5 = (long)lParse->nCols;
    if (lVar5 != 0) {
      lVar6 = lVar5 * 0xa0;
      do {
        if (parName[lVar5 + 0xff] == '\0') {
          snprintf(parName,0x100,"Parameter not found: %-30s",lParse->varData[-1].name + lVar6);
          ffpmsg(parName);
          *status = 0x1af;
        }
        lVar5 = lVar5 + -1;
        lVar6 = lVar6 + -0xa0;
      } while (lVar5 != 0);
    }
  }
LAB_00129700:
  return *status;
}

Assistant:

int fits_uncompress_hkdata( ParseData *lParse,
		       fitsfile *fptr,
                       long     ntimes,
                       double   *times,
                       int      *status )
/*                                                                           */
/* description                                                               */
/*---------------------------------------------------------------------------*/
{
   char parName[256], *sPtr[1], found[1000];
   int parNo, anynul;
   long naxis2, row, currelem;
   double currtime, newtime;

   sPtr[0] = parName;
   currelem = 0;
   currtime = -1e38;

   parNo=lParse->nCols;
   while( parNo-- ) found[parNo] = 0;

   if( ffgkyj( fptr, "NAXIS2", &naxis2, NULL, status ) ) return( *status );

   for( row=1; row<=naxis2; row++ ) {
      if( ffgcvd( fptr, lParse->timeCol, row, 1L, 1L, 0.0,
                  &newtime, &anynul, status ) ) return( *status );
      if( newtime != currtime ) {
         /*  New time encountered... propogate parameters to next row  */
         if( currelem==ntimes ) {
            ffpmsg("Found more unique time stamps than caller indicated");
            return( *status = PARSE_BAD_COL );
         }
         times[currelem++] = currtime = newtime;
         parNo = lParse->nCols;
         while( parNo-- ) {
            switch( lParse->colData[parNo].datatype ) {
            case TLONG:
               ((long*)lParse->colData[parNo].array)[currelem] =
                  ((long*)lParse->colData[parNo].array)[currelem-1];
               break;
            case TDOUBLE:
               ((double*)lParse->colData[parNo].array)[currelem] =
                  ((double*)lParse->colData[parNo].array)[currelem-1];
               break;
            case TSTRING:
               strcpy( ((char **)lParse->colData[parNo].array)[currelem],
                       ((char **)lParse->colData[parNo].array)[currelem-1] );
               break;
            }
         }
      }

      if( ffgcvs( fptr, lParse->parCol, row, 1L, 1L, "",
                  sPtr, &anynul, status ) ) return( *status );
      parNo = lParse->nCols;
      while( parNo-- )
         if( !fits_strcasecmp( parName, lParse->varData[parNo].name ) ) break;

      if( parNo>=0 ) {
         found[parNo] = 1; /* Flag this parameter as found */
         switch( lParse->colData[parNo].datatype ) {
         case TLONG:
            ffgcvj( fptr, lParse->valCol, row, 1L, 1L,
                    ((long*)lParse->colData[parNo].array)[0],
                    ((long*)lParse->colData[parNo].array)+currelem,
                    &anynul, status );
            break;
         case TDOUBLE:
            ffgcvd( fptr, lParse->valCol, row, 1L, 1L,
                    ((double*)lParse->colData[parNo].array)[0],
                    ((double*)lParse->colData[parNo].array)+currelem,
                    &anynul, status );
            break;
         case TSTRING:
            ffgcvs( fptr, lParse->valCol, row, 1L, 1L,
                    ((char**)lParse->colData[parNo].array)[0],
                    ((char**)lParse->colData[parNo].array)+currelem,
                    &anynul, status );
            break;
         }
         if( *status ) return( *status );
      }
   }

   if( currelem<ntimes ) {
      ffpmsg("Found fewer unique time stamps than caller indicated");
      return( *status = PARSE_BAD_COL );
   }

   /*  Check for any parameters which were not located in the table  */
   parNo = lParse->nCols;
   while( parNo-- )
      if( !found[parNo] ) {
         snprintf( parName, 256, "Parameter not found: %-30s", 
                  lParse->varData[parNo].name );
         ffpmsg( parName );
         *status = PARSE_SYNTAX_ERR;
      }
   return( *status );
}